

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

HuffmanTreeToken *
CodeRepeatedValues(int repetitions,HuffmanTreeToken *tokens,int value,int prev_value)

{
  int i;
  int prev_value_local;
  int value_local;
  HuffmanTreeToken *tokens_local;
  int repetitions_local;
  
  tokens_local = tokens;
  repetitions_local = repetitions;
  if (value != prev_value) {
    tokens->code = (uint8_t)value;
    tokens->extra_bits = '\0';
    tokens_local = tokens + 1;
    repetitions_local = repetitions + -1;
  }
  while( true ) {
    if (repetitions_local < 1) {
      return tokens_local;
    }
    if (repetitions_local < 3) break;
    if (repetitions_local < 7) {
      tokens_local->code = '\x10';
      tokens_local->extra_bits = (char)repetitions_local + 0xfd;
      return tokens_local + 1;
    }
    tokens_local->code = '\x10';
    tokens_local->extra_bits = '\x03';
    tokens_local = tokens_local + 1;
    repetitions_local = repetitions_local + -6;
  }
  for (i = 0; i < repetitions_local; i = i + 1) {
    tokens_local->code = (uint8_t)value;
    tokens_local->extra_bits = '\0';
    tokens_local = tokens_local + 1;
  }
  return tokens_local;
}

Assistant:

static HuffmanTreeToken* CodeRepeatedValues(int repetitions,
                                            HuffmanTreeToken* tokens,
                                            int value, int prev_value) {
  assert(value <= MAX_ALLOWED_CODE_LENGTH);
  if (value != prev_value) {
    tokens->code = value;
    tokens->extra_bits = 0;
    ++tokens;
    --repetitions;
  }
  while (repetitions >= 1) {
    if (repetitions < 3) {
      int i;
      for (i = 0; i < repetitions; ++i) {
        tokens->code = value;
        tokens->extra_bits = 0;
        ++tokens;
      }
      break;
    } else if (repetitions < 7) {
      tokens->code = 16;
      tokens->extra_bits = repetitions - 3;
      ++tokens;
      break;
    } else {
      tokens->code = 16;
      tokens->extra_bits = 3;
      ++tokens;
      repetitions -= 6;
    }
  }
  return tokens;
}